

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall
util_tests::test_LocaleIndependentAtoi::test_method(test_LocaleIndependentAtoi *this)

{
  long lVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  __l;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  string_view str_25;
  string_view str_26;
  string_view str_27;
  string_view str_28;
  string_view str_29;
  string_view str_30;
  string_view str_31;
  string_view str_32;
  string_view str_33;
  string_view str_34;
  string_view str_35;
  string_view str_36;
  string_view str_37;
  string_view str_38;
  string_view str_39;
  string_view str_40;
  string_view str_41;
  string_view str_42;
  string_view str_43;
  string_view str_44;
  string_view str_45;
  string_view str_46;
  string_view str_47;
  string_view str_48;
  string_view str_49;
  string_view str_50;
  string_view str_51;
  string_view str_52;
  string_view str_53;
  string_view str_54;
  string_view str_55;
  string_view str_56;
  string_view str_57;
  string_view str_58;
  bool bVar2;
  reference ppVar3;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffda38;
  lazy_ostream *in_stack_ffffffffffffda40;
  char *in_stack_ffffffffffffda48;
  char *in_stack_ffffffffffffda50;
  undefined6 in_stack_ffffffffffffda58;
  undefined1 in_stack_ffffffffffffda5e;
  uchar in_stack_ffffffffffffda5f;
  lazy_ostream *in_stack_ffffffffffffda60;
  char (*in_stack_ffffffffffffda68) [21];
  size_t line_num;
  undefined6 in_stack_ffffffffffffda70;
  undefined1 in_stack_ffffffffffffda76;
  uchar in_stack_ffffffffffffda77;
  lazy_ostream *in_stack_ffffffffffffda78;
  allocator_type *in_stack_ffffffffffffda80;
  undefined6 in_stack_ffffffffffffda88;
  undefined1 in_stack_ffffffffffffda8e;
  undefined1 in_stack_ffffffffffffda8f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *in_stack_ffffffffffffda90;
  undefined6 in_stack_ffffffffffffdaa0;
  undefined1 in_stack_ffffffffffffdaa6;
  undefined1 in_stack_ffffffffffffdaa7;
  size_type in_stack_ffffffffffffdaa8;
  undefined8 in_stack_ffffffffffffdab0;
  size_t sVar4;
  undefined6 in_stack_ffffffffffffdab8;
  undefined1 in_stack_ffffffffffffdabe;
  char in_stack_ffffffffffffdabf;
  _Rb_tree_header *local_2270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *pair_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *pair;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *__range1;
  test_LocaleIndependentAtoi *this_local;
  lazy_ostream local_1be4;
  uchar local_1bc9;
  undefined1 local_1bc8 [16];
  undefined1 local_1bb8 [68];
  lazy_ostream local_1b74;
  uchar local_1b59;
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [68];
  lazy_ostream local_1b04;
  uchar local_1ae9;
  undefined1 local_1ae8 [16];
  undefined1 local_1ad8 [68];
  lazy_ostream local_1a94;
  uchar local_1a79;
  undefined1 local_1a78 [16];
  undefined1 local_1a68 [68];
  lazy_ostream local_1a24;
  char local_1a09;
  undefined1 local_1a08 [16];
  undefined1 local_19f8 [68];
  lazy_ostream local_19b4;
  char local_1999;
  undefined1 local_1998 [16];
  undefined1 local_1988 [68];
  lazy_ostream local_1944;
  char local_1929;
  undefined1 local_1928 [16];
  undefined1 local_1918 [68];
  lazy_ostream local_18d4;
  char local_18b9;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [68];
  lazy_ostream local_1864;
  unsigned_short local_184a;
  undefined1 local_1848 [16];
  undefined1 local_1838 [68];
  lazy_ostream local_17f4;
  unsigned_short local_17da;
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [68];
  lazy_ostream local_1784;
  unsigned_short local_176a;
  undefined1 local_1768 [16];
  undefined1 local_1758 [68];
  lazy_ostream local_1714;
  unsigned_short local_16fa;
  undefined1 local_16f8 [16];
  undefined1 local_16e8 [68];
  lazy_ostream local_16a4;
  short local_168a;
  undefined1 local_1688 [16];
  undefined1 local_1678 [68];
  lazy_ostream local_1634;
  short local_161a;
  undefined1 local_1618 [16];
  undefined1 local_1608 [68];
  lazy_ostream local_15c4;
  short local_15aa;
  undefined1 local_15a8 [16];
  undefined1 local_1598 [68];
  lazy_ostream local_1554;
  short local_153a;
  undefined1 local_1538 [16];
  undefined1 local_1528 [68];
  lazy_ostream local_14e4;
  uint local_14cc;
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [68];
  lazy_ostream local_1474;
  uint local_145c;
  undefined1 local_1458 [16];
  undefined1 local_1448 [68];
  lazy_ostream local_1404;
  uint local_13ec;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [68];
  lazy_ostream local_1394;
  uint local_137c;
  undefined1 local_1378 [16];
  undefined1 local_1368 [68];
  lazy_ostream local_1324;
  int local_130c;
  undefined1 local_1308 [16];
  undefined1 local_12f8 [68];
  lazy_ostream local_12b4;
  int local_129c;
  undefined1 local_1298 [16];
  undefined1 local_1288 [64];
  lazy_ostream local_1248;
  int local_122c;
  undefined1 local_1228 [16];
  undefined1 local_1218 [64];
  lazy_ostream local_11d8;
  int local_11bc;
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [64];
  lazy_ostream local_1168;
  unsigned_long local_1150;
  undefined1 local_1148 [16];
  undefined1 local_1138 [64];
  lazy_ostream local_10f8;
  unsigned_long local_10e0;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [68];
  lazy_ostream local_1084;
  unsigned_long local_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [68];
  lazy_ostream local_1014;
  unsigned_long local_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [64];
  lazy_ostream local_fa8;
  undefined1 local_f98 [16];
  undefined1 local_f88 [64];
  iterator __end1_1;
  iterator __begin1_1;
  long local_f38;
  undefined1 local_f30 [16];
  undefined1 local_f20 [64];
  iterator __end1;
  iterator __begin1;
  lazy_ostream local_e98;
  long local_e80;
  undefined1 local_e78 [16];
  undefined1 local_e68 [64];
  lazy_ostream local_e28;
  long local_e10;
  undefined1 local_e08 [16];
  undefined1 local_df8 [64];
  lazy_ostream local_db8;
  long local_da0;
  undefined1 local_d98 [16];
  undefined1 local_d88 [64];
  lazy_ostream local_d48;
  long local_d30;
  undefined1 local_d28 [16];
  undefined1 local_d18 [68];
  lazy_ostream local_cd4;
  int local_cbc;
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [68];
  lazy_ostream local_c64;
  int local_c4c;
  undefined1 local_c48 [16];
  undefined1 local_c38 [68];
  lazy_ostream local_bf4;
  int local_bdc;
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [68];
  lazy_ostream local_b84;
  int local_b6c;
  undefined1 local_b68 [16];
  undefined1 local_b58 [68];
  lazy_ostream local_b14;
  int local_afc;
  undefined1 local_af8 [16];
  undefined1 local_ae8 [68];
  lazy_ostream local_aa4;
  int local_a8c;
  undefined1 local_a88 [16];
  undefined1 local_a78 [68];
  lazy_ostream local_a34;
  int local_a1c;
  undefined1 local_a18 [16];
  undefined1 local_a08 [68];
  lazy_ostream local_9c4;
  int local_9ac;
  undefined1 local_9a8 [16];
  undefined1 local_998 [68];
  lazy_ostream local_954;
  int local_93c;
  undefined1 local_938 [16];
  undefined1 local_928 [68];
  lazy_ostream local_8e4;
  int local_8cc;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [68];
  lazy_ostream local_874;
  int local_85c;
  undefined1 local_858 [16];
  undefined1 local_848 [68];
  lazy_ostream local_804;
  int local_7ec;
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [68];
  lazy_ostream local_794;
  int local_77c;
  undefined1 local_778 [16];
  undefined1 local_768 [68];
  lazy_ostream local_724;
  int local_70c;
  undefined1 local_708 [16];
  undefined1 local_6f8 [68];
  lazy_ostream local_6b4;
  int local_69c;
  undefined1 local_698 [16];
  undefined1 local_688 [68];
  lazy_ostream local_644;
  int local_62c;
  undefined1 local_628 [16];
  undefined1 local_618 [68];
  lazy_ostream local_5d4;
  int local_5bc;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [68];
  lazy_ostream local_564;
  int local_54c;
  undefined1 local_548 [16];
  undefined1 local_538 [68];
  lazy_ostream local_4f4;
  int local_4dc;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [68];
  lazy_ostream local_484;
  int local_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [68];
  lazy_ostream local_414;
  int local_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [68];
  lazy_ostream local_3a4;
  int local_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [68];
  lazy_ostream local_334;
  int local_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [68];
  lazy_ostream local_2c4;
  int local_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [68];
  lazy_ostream local_254;
  int local_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [68];
  lazy_ostream local_1e4;
  int local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [64];
  undefined1 local_178 [320];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  atoi64_test_pairs;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str._M_len = in_stack_ffffffffffffdab0;
    str._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1cc = LocaleIndependentAtoi<int>(str);
    local_1e4._vptr_lazy_ostream._0_4_ = 0x4d2;
    in_stack_ffffffffffffda48 = "1\'234";
    in_stack_ffffffffffffda40 = &local_1e4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"1234\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1b8,local_1c8,0x2f4,1,2,&local_1cc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_00._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_00._M_len = in_stack_ffffffffffffdab0;
    str_00._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_00._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_23c = LocaleIndependentAtoi<int>(str_00);
    local_254._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_254;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"0\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_228,local_238,0x2f5,1,2,&local_23c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_01._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_01._M_len = in_stack_ffffffffffffdab0;
    str_01._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_01._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_2ac = LocaleIndependentAtoi<int>(str_01);
    local_2c4._vptr_lazy_ostream._0_4_ = 0x4d2;
    in_stack_ffffffffffffda48 = "1\'234";
    in_stack_ffffffffffffda40 = &local_2c4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"01234\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_298,local_2a8,0x2f6,1,2,&local_2ac);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_02._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_02._M_len = in_stack_ffffffffffffdab0;
    str_02._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_02._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_31c = LocaleIndependentAtoi<int>(str_02);
    local_334._vptr_lazy_ostream._0_4_ = 0xfffffb2e;
    in_stack_ffffffffffffda48 = "-1\'234";
    in_stack_ffffffffffffda40 = &local_334;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-1234\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_308,local_318,0x2f7,1,2,&local_31c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_03._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_03._M_len = in_stack_ffffffffffffdab0;
    str_03._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_03._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_38c = LocaleIndependentAtoi<int>(str_03);
    local_3a4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_3a4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\" 1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_378,local_388,0x2f8,1,2,&local_38c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_04._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_04._M_len = in_stack_ffffffffffffdab0;
    str_04._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_04._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_3fc = LocaleIndependentAtoi<int>(str_04);
    local_414._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_414;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"1 \")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_3e8,local_3f8,0x2f9,1,2,&local_3fc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_05._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_05._M_len = in_stack_ffffffffffffdab0;
    str_05._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_05._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_46c = LocaleIndependentAtoi<int>(str_05);
    local_484._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_484;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"1a\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_458,local_468,0x2fa,1,2,&local_46c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_06._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_06._M_len = in_stack_ffffffffffffdab0;
    str_06._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_06._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_4dc = LocaleIndependentAtoi<int>(str_06);
    local_4f4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_4f4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"1.1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_4c8,local_4d8,0x2fb,1,2,&local_4dc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_07._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_07._M_len = in_stack_ffffffffffffdab0;
    str_07._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_07._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_54c = LocaleIndependentAtoi<int>(str_07);
    local_564._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_564;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"1.9\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_538,local_548,0x2fc,1,2,&local_54c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_08._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_08._M_len = in_stack_ffffffffffffdab0;
    str_08._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_08._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_5bc = LocaleIndependentAtoi<int>(str_08);
    local_5d4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_5d4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"+01.9\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_5a8,local_5b8,0x2fd,1,2,&local_5bc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_09._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_09._M_len = in_stack_ffffffffffffdab0;
    str_09._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_09._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_62c = LocaleIndependentAtoi<int>(str_09);
    local_644._vptr_lazy_ostream._0_4_ = 0xffffffff;
    in_stack_ffffffffffffda48 = "-1";
    in_stack_ffffffffffffda40 = &local_644;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_618,local_628,0x2fe,1,2,&local_62c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_10._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_10._M_len = in_stack_ffffffffffffdab0;
    str_10._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_10._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_69c = LocaleIndependentAtoi<int>(str_10);
    local_6b4._vptr_lazy_ostream._0_4_ = 0xffffffff;
    in_stack_ffffffffffffda48 = "-1";
    in_stack_ffffffffffffda40 = &local_6b4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\" -1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_688,local_698,0x2ff,1,2,&local_69c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_11._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_11._M_len = in_stack_ffffffffffffdab0;
    str_11._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_11._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_70c = LocaleIndependentAtoi<int>(str_11);
    local_724._vptr_lazy_ostream._0_4_ = 0xffffffff;
    in_stack_ffffffffffffda48 = "-1";
    in_stack_ffffffffffffda40 = &local_724;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-1 \")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_6f8,local_708,0x300,1,2,&local_70c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_12._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_12._M_len = in_stack_ffffffffffffdab0;
    str_12._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_12._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_77c = LocaleIndependentAtoi<int>(str_12);
    local_794._vptr_lazy_ostream._0_4_ = 0xffffffff;
    in_stack_ffffffffffffda48 = "-1";
    in_stack_ffffffffffffda40 = &local_794;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\" -1 \")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_768,local_778,0x301,1,2,&local_77c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_13._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_13._M_len = in_stack_ffffffffffffdab0;
    str_13._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_13._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_7ec = LocaleIndependentAtoi<int>(str_13);
    local_804._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_804;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"+1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_7d8,local_7e8,0x302,1,2,&local_7ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_14._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_14._M_len = in_stack_ffffffffffffdab0;
    str_14._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_14._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_85c = LocaleIndependentAtoi<int>(str_14);
    local_874._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_874;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\" +1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_848,local_858,0x303,1,2,&local_85c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_15._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_15._M_len = in_stack_ffffffffffffdab0;
    str_15._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_15._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_8cc = LocaleIndependentAtoi<int>(str_15);
    local_8e4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffda48 = "1";
    in_stack_ffffffffffffda40 = &local_8e4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\" +1 \")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_8b8,local_8c8,0x304,1,2,&local_8cc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_16._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_16._M_len = in_stack_ffffffffffffdab0;
    str_16._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_16._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_93c = LocaleIndependentAtoi<int>(str_16);
    local_954._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_954;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"+-1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_928,local_938,0x306,1,2,&local_93c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_17._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_17._M_len = in_stack_ffffffffffffdab0;
    str_17._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_17._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_9ac = LocaleIndependentAtoi<int>(str_17);
    local_9c4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_9c4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-+1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_998,local_9a8,0x307,1,2,&local_9ac);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_18._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_18._M_len = in_stack_ffffffffffffdab0;
    str_18._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_18._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_a1c = LocaleIndependentAtoi<int>(str_18);
    local_a34._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_a34;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"++1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_a08,local_a18,0x308,1,2,&local_a1c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_19._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_19._M_len = in_stack_ffffffffffffdab0;
    str_19._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_19._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_a8c = LocaleIndependentAtoi<int>(str_19);
    local_aa4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_aa4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"--1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_a78,local_a88,0x309,1,2,&local_a8c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_20._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_20._M_len = in_stack_ffffffffffffdab0;
    str_20._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_20._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_afc = LocaleIndependentAtoi<int>(str_20);
    local_b14._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_b14;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_ae8,local_af8,0x30a,1,2,&local_afc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_21._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_21._M_len = in_stack_ffffffffffffdab0;
    str_21._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_21._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_b6c = LocaleIndependentAtoi<int>(str_21);
    local_b84._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_b84;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"aap\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b58,local_b68,0x30b,1,2,&local_b6c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_22._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_22._M_len = in_stack_ffffffffffffdab0;
    str_22._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_22._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_bdc = LocaleIndependentAtoi<int>(str_22);
    local_bf4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0";
    in_stack_ffffffffffffda40 = &local_bf4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"0x1\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_bc8,local_bd8,0x30c,1,2,&local_bdc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_23._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_23._M_len = in_stack_ffffffffffffdab0;
    str_23._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_23._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_c4c = LocaleIndependentAtoi<int>(str_23);
    local_c64._vptr_lazy_ostream._0_4_ = 0x80000000;
    in_stack_ffffffffffffda48 = "-2\'147\'483\'647 - 1";
    in_stack_ffffffffffffda40 = &local_c64;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-32482348723847471234\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_c38,local_c48,0x30d,1,2,&local_c4c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_24._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_24._M_len = in_stack_ffffffffffffdab0;
    str_24._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_24._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_cbc = LocaleIndependentAtoi<int>(str_24);
    local_cd4._vptr_lazy_ostream._0_4_ = 0x7fffffff;
    in_stack_ffffffffffffda48 = "2\'147\'483\'647";
    in_stack_ffffffffffffda40 = &local_cd4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"32482348723847471234\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_ca8,local_cb8,0x30e,1,2,&local_cbc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_25._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_25._M_len = in_stack_ffffffffffffdab0;
    str_25._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_25._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_d30 = LocaleIndependentAtoi<long>(str_25);
    local_d48._vptr_lazy_ostream = (_func_int **)0x8000000000000000;
    in_stack_ffffffffffffda48 = "-9\'223\'372\'036\'854\'775\'807LL - 1LL";
    in_stack_ffffffffffffda40 = &local_d48;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int64_t>(\"-9223372036854775809\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_d18,local_d28,0x310,1,2,&local_d30);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_26._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_26._M_len = in_stack_ffffffffffffdab0;
    str_26._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_26._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_da0 = LocaleIndependentAtoi<long>(str_26);
    local_db8._vptr_lazy_ostream = (_func_int **)0x8000000000000000;
    in_stack_ffffffffffffda48 = "-9\'223\'372\'036\'854\'775\'807LL - 1LL";
    in_stack_ffffffffffffda40 = &local_db8;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int64_t>(\"-9223372036854775808\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_d88,local_d98,0x311,1,2,&local_da0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_27._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_27._M_len = in_stack_ffffffffffffdab0;
    str_27._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_27._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_e10 = LocaleIndependentAtoi<long>(str_27);
    local_e28._vptr_lazy_ostream = (_func_int **)0x7fffffffffffffff;
    in_stack_ffffffffffffda48 = "9\'223\'372\'036\'854\'775\'807";
    in_stack_ffffffffffffda40 = &local_e28;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int64_t>(\"9223372036854775807\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_df8,local_e08,0x312,1,2,&local_e10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_28._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_28._M_len = in_stack_ffffffffffffdab0;
    str_28._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_28._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_e80 = LocaleIndependentAtoi<long>(str_28);
    local_e98._vptr_lazy_ostream = (_func_int **)0x7fffffffffffffff;
    in_stack_ffffffffffffda48 = "9\'223\'372\'036\'854\'775\'807";
    in_stack_ffffffffffffda40 = &local_e98;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int64_t>(\"9223372036854775808\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_e68,local_e78,0x313,1,2,&local_e80);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::numeric_limits<long>::min();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[21],_long,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             in_stack_ffffffffffffda68,(long *)in_stack_ffffffffffffda60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[21],_long_long,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             in_stack_ffffffffffffda68,(longlong *)in_stack_ffffffffffffda60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[20],_long,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             (char (*) [20])in_stack_ffffffffffffda68,(long *)in_stack_ffffffffffffda60);
  std::numeric_limits<long>::max();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[20],_long,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             (char (*) [20])in_stack_ffffffffffffda68,(long *)in_stack_ffffffffffffda60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[3],_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             (char (*) [3])in_stack_ffffffffffffda68,(int *)in_stack_ffffffffffffda60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[4],_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             (char (*) [4])in_stack_ffffffffffffda68,(int *)in_stack_ffffffffffffda60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[4],_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             (char (*) [4])in_stack_ffffffffffffda68,(int *)in_stack_ffffffffffffda60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[1],_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)CONCAT17(in_stack_ffffffffffffda77,
                         CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
             (char (*) [1])in_stack_ffffffffffffda68,(int *)in_stack_ffffffffffffda60);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               *)in_stack_ffffffffffffda38);
  __l._M_array._6_1_ = in_stack_ffffffffffffdaa6;
  __l._M_array._0_6_ = in_stack_ffffffffffffdaa0;
  __l._M_array._7_1_ = in_stack_ffffffffffffdaa7;
  __l._M_len = in_stack_ffffffffffffdaa8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map(in_stack_ffffffffffffda90,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        CONCAT17(in_stack_ffffffffffffda8f,
                 CONCAT16(in_stack_ffffffffffffda8e,in_stack_ffffffffffffda88)),
        in_stack_ffffffffffffda80);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)in_stack_ffffffffffffda38);
  local_2270 = (_Rb_tree_header *)&atoi64_test_pairs;
  do {
    local_2270 = local_2270 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
             *)in_stack_ffffffffffffda38);
  } while (local_2270 != (_Rb_tree_header *)local_178);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           *)in_stack_ffffffffffffda40);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)in_stack_ffffffffffffda40);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffda48,
                                 (_Self *)in_stack_ffffffffffffda40), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                          *)in_stack_ffffffffffffda38);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
                 (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffda78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffda77,
                          CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
                 (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
                 (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffda5f,
                          CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)));
      str_29._M_str._0_6_ = in_stack_ffffffffffffdab8;
      str_29._M_len = in_stack_ffffffffffffdab0;
      str_29._M_str._6_1_ = in_stack_ffffffffffffdabe;
      str_29._M_str._7_1_ = in_stack_ffffffffffffdabf;
      local_f38 = LocaleIndependentAtoi<long>(str_29);
      in_stack_ffffffffffffda40 = (lazy_ostream *)&ppVar3->second;
      in_stack_ffffffffffffda48 = "pair.second";
      in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int64_t>(pair.first)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_f20,local_f30,0x321,1,2,&local_f38);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffda38);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                  *)in_stack_ffffffffffffda38);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           *)in_stack_ffffffffffffda40);
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    *)in_stack_ffffffffffffda40);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffda48,
                                 (_Self *)in_stack_ffffffffffffda40), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                 *)in_stack_ffffffffffffda38);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
                 (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffda78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffda77,
                          CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
                 (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
                 (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffda5f,
                          CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)));
      str_30._M_str._0_6_ = in_stack_ffffffffffffdab8;
      str_30._M_len = in_stack_ffffffffffffdab0;
      str_30._M_str._6_1_ = in_stack_ffffffffffffdabe;
      str_30._M_str._7_1_ = in_stack_ffffffffffffdabf;
      local_fa8._8_8_ = LocaleIndependentAtoi<long>(str_30);
      local_fa8._vptr_lazy_ostream =
           (_func_int **)atoi64_legacy((string *)in_stack_ffffffffffffda38);
      in_stack_ffffffffffffda48 = "atoi64_legacy(pair.first)";
      in_stack_ffffffffffffda40 = &local_fa8;
      in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int64_t>(pair.first)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_f88,local_f98,0x326,1,2,&local_fa8.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffda38);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                  *)in_stack_ffffffffffffda38);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_31._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_31._M_len = in_stack_ffffffffffffdab0;
    str_31._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_31._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1000 = LocaleIndependentAtoi<unsigned_long>(str_31);
    local_1014._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1014;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint64_t>(\"-1\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_fe8,local_ff8,0x329,1,2,&local_1000);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_32._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_32._M_len = in_stack_ffffffffffffdab0;
    str_32._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_32._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1070 = LocaleIndependentAtoi<unsigned_long>(str_32);
    local_1084._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1084;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint64_t>(\"0\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1058,local_1068,0x32a,1,2,&local_1070);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_33._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_33._M_len = in_stack_ffffffffffffdab0;
    str_33._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_33._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_10e0 = LocaleIndependentAtoi<unsigned_long>(str_33);
    local_10f8._vptr_lazy_ostream = (_func_int **)0xffffffffffffffff;
    in_stack_ffffffffffffda48 = "18\'446\'744\'073\'709\'551\'615ULL";
    in_stack_ffffffffffffda40 = &local_10f8;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint64_t>(\"18446744073709551615\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_10c8,local_10d8,0x32b,1,2,&local_10e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_34._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_34._M_len = in_stack_ffffffffffffdab0;
    str_34._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_34._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1150 = LocaleIndependentAtoi<unsigned_long>(str_34);
    local_1168._vptr_lazy_ostream = (_func_int **)0xffffffffffffffff;
    in_stack_ffffffffffffda48 = "18\'446\'744\'073\'709\'551\'615ULL";
    in_stack_ffffffffffffda40 = &local_1168;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint64_t>(\"18446744073709551616\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_1138,local_1148,0x32c,1,2,&local_1150);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_35._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_35._M_len = in_stack_ffffffffffffdab0;
    str_35._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_35._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_11bc = LocaleIndependentAtoi<int>(str_35);
    local_11d8._vptr_lazy_ostream = (_func_int **)0xffffffff80000000;
    in_stack_ffffffffffffda48 = "-2\'147\'483\'648LL";
    in_stack_ffffffffffffda40 = &local_11d8;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-2147483649\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long_long>
              (local_11a8,local_11b8,0x32e,1,2,&local_11bc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_36._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_36._M_len = in_stack_ffffffffffffdab0;
    str_36._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_36._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_122c = LocaleIndependentAtoi<int>(str_36);
    local_1248._vptr_lazy_ostream = (_func_int **)0xffffffff80000000;
    in_stack_ffffffffffffda48 = "-2\'147\'483\'648LL";
    in_stack_ffffffffffffda40 = &local_1248;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"-2147483648\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long_long>
              (local_1218,local_1228,0x32f,1,2,&local_122c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_37._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_37._M_len = in_stack_ffffffffffffdab0;
    str_37._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_37._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_129c = LocaleIndependentAtoi<int>(str_37);
    local_12b4._vptr_lazy_ostream._0_4_ = 0x7fffffff;
    in_stack_ffffffffffffda48 = "2\'147\'483\'647";
    in_stack_ffffffffffffda40 = &local_12b4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"2147483647\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1288,local_1298,0x330,1,2,&local_129c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_38._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_38._M_len = in_stack_ffffffffffffdab0;
    str_38._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_38._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_130c = LocaleIndependentAtoi<int>(str_38);
    local_1324._vptr_lazy_ostream._0_4_ = 0x7fffffff;
    in_stack_ffffffffffffda48 = "2\'147\'483\'647";
    in_stack_ffffffffffffda40 = &local_1324;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int32_t>(\"2147483648\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_12f8,local_1308,0x331,1,2,&local_130c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_39._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_39._M_len = in_stack_ffffffffffffdab0;
    str_39._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_39._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_137c = LocaleIndependentAtoi<unsigned_int>(str_39);
    local_1394._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1394;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint32_t>(\"-1\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1368,local_1378,0x333,1,2,&local_137c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_40._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_40._M_len = in_stack_ffffffffffffdab0;
    str_40._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_40._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_13ec = LocaleIndependentAtoi<unsigned_int>(str_40);
    local_1404._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1404;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint32_t>(\"0\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_13d8,local_13e8,0x334,1,2,&local_13ec);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_41._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_41._M_len = in_stack_ffffffffffffdab0;
    str_41._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_41._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_145c = LocaleIndependentAtoi<unsigned_int>(str_41);
    local_1474._vptr_lazy_ostream._0_4_ = 0xffffffff;
    in_stack_ffffffffffffda48 = "4\'294\'967\'295U";
    in_stack_ffffffffffffda40 = &local_1474;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint32_t>(\"4294967295\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1448,local_1458,0x335,1,2,&local_145c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_42._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_42._M_len = in_stack_ffffffffffffdab0;
    str_42._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_42._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_14cc = LocaleIndependentAtoi<unsigned_int>(str_42);
    local_14e4._vptr_lazy_ostream._0_4_ = 0xffffffff;
    in_stack_ffffffffffffda48 = "4\'294\'967\'295U";
    in_stack_ffffffffffffda40 = &local_14e4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint32_t>(\"4294967296\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_14b8,local_14c8,0x336,1,2,&local_14cc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_43._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_43._M_len = in_stack_ffffffffffffdab0;
    str_43._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_43._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_153a = LocaleIndependentAtoi<short>(str_43);
    local_1554._vptr_lazy_ostream._0_4_ = 0xffff8000;
    in_stack_ffffffffffffda48 = "-32\'768";
    in_stack_ffffffffffffda40 = &local_1554;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int16_t>(\"-32769\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
              (local_1528,local_1538,0x338,1,2,&local_153a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_44._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_44._M_len = in_stack_ffffffffffffdab0;
    str_44._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_44._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_15aa = LocaleIndependentAtoi<short>(str_44);
    local_15c4._vptr_lazy_ostream._0_4_ = 0xffff8000;
    in_stack_ffffffffffffda48 = "-32\'768";
    in_stack_ffffffffffffda40 = &local_15c4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int16_t>(\"-32768\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
              (local_1598,local_15a8,0x339,1,2,&local_15aa);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_45._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_45._M_len = in_stack_ffffffffffffdab0;
    str_45._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_45._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_161a = LocaleIndependentAtoi<short>(str_45);
    local_1634._vptr_lazy_ostream._0_4_ = 0x7fff;
    in_stack_ffffffffffffda48 = "32\'767";
    in_stack_ffffffffffffda40 = &local_1634;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int16_t>(\"32767\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
              (local_1608,local_1618,0x33a,1,2,&local_161a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_46._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_46._M_len = in_stack_ffffffffffffdab0;
    str_46._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_46._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_168a = LocaleIndependentAtoi<short>(str_46);
    local_16a4._vptr_lazy_ostream._0_4_ = 0x7fff;
    in_stack_ffffffffffffda48 = "32\'767";
    in_stack_ffffffffffffda40 = &local_16a4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int16_t>(\"32768\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
              (local_1678,local_1688,0x33b,1,2,&local_168a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_47._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_47._M_len = in_stack_ffffffffffffdab0;
    str_47._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_47._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_16fa = LocaleIndependentAtoi<unsigned_short>(str_47);
    local_1714._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1714;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint16_t>(\"-1\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
              (local_16e8,local_16f8,0x33d,1,2,&local_16fa);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_48._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_48._M_len = in_stack_ffffffffffffdab0;
    str_48._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_48._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_176a = LocaleIndependentAtoi<unsigned_short>(str_48);
    local_1784._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1784;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint16_t>(\"0\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
              (local_1758,local_1768,0x33e,1,2,&local_176a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_49._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_49._M_len = in_stack_ffffffffffffdab0;
    str_49._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_49._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_17da = LocaleIndependentAtoi<unsigned_short>(str_49);
    local_17f4._vptr_lazy_ostream._0_4_ = 0xffff;
    in_stack_ffffffffffffda48 = "65\'535U";
    in_stack_ffffffffffffda40 = &local_17f4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint16_t>(\"65535\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
              (local_17c8,local_17d8,0x33f,1,2,&local_17da);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_50._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_50._M_len = in_stack_ffffffffffffdab0;
    str_50._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_50._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_184a = LocaleIndependentAtoi<unsigned_short>(str_50);
    local_1864._vptr_lazy_ostream._0_4_ = 0xffff;
    in_stack_ffffffffffffda48 = "65\'535U";
    in_stack_ffffffffffffda40 = &local_1864;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint16_t>(\"65536\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
              (local_1838,local_1848,0x340,1,2,&local_184a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_51._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_51._M_len = in_stack_ffffffffffffdab0;
    str_51._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_51._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_18b9 = LocaleIndependentAtoi<signed_char>(str_51);
    local_18d4._vptr_lazy_ostream._0_4_ = 0xffffff80;
    in_stack_ffffffffffffda48 = "-128";
    in_stack_ffffffffffffda40 = &local_18d4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int8_t>(\"-129\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
              (local_18a8,local_18b8,0x342,1,2,&local_18b9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_52._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_52._M_len = in_stack_ffffffffffffdab0;
    str_52._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_52._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1929 = LocaleIndependentAtoi<signed_char>(str_52);
    local_1944._vptr_lazy_ostream._0_4_ = 0xffffff80;
    in_stack_ffffffffffffda48 = "-128";
    in_stack_ffffffffffffda40 = &local_1944;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int8_t>(\"-128\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
              (local_1918,local_1928,0x343,1,2,&local_1929);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_53._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_53._M_len = in_stack_ffffffffffffdab0;
    str_53._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_53._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1999 = LocaleIndependentAtoi<signed_char>(str_53);
    local_19b4._vptr_lazy_ostream._0_4_ = 0x7f;
    in_stack_ffffffffffffda48 = "127";
    in_stack_ffffffffffffda40 = &local_19b4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int8_t>(\"127\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
              (local_1988,local_1998,0x344,1,2,&local_1999);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_54._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_54._M_len = in_stack_ffffffffffffdab0;
    str_54._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_54._M_str._7_1_ = in_stack_ffffffffffffdabf;
    in_stack_ffffffffffffdabf = LocaleIndependentAtoi<signed_char>(str_54);
    local_1a24._vptr_lazy_ostream._0_4_ = 0x7f;
    in_stack_ffffffffffffda48 = "127";
    in_stack_ffffffffffffda40 = &local_1a24;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<int8_t>(\"128\")";
    local_1a09 = in_stack_ffffffffffffdabf;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
              (local_19f8,local_1a08,0x345,1,2,&local_1a09);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    in_stack_ffffffffffffdabe = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdabe);
  do {
    sVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_55._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_55._M_len = sVar4;
    str_55._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_55._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1a79 = LocaleIndependentAtoi<unsigned_char>(str_55);
    local_1a94._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1a94;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint8_t>(\"-1\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
              (local_1a68,local_1a78,0x347,1,2,&local_1a79);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_56._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_56._M_len = sVar4;
    str_56._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_56._M_str._7_1_ = in_stack_ffffffffffffdabf;
    local_1ae9 = LocaleIndependentAtoi<unsigned_char>(str_56);
    local_1b04._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffda48 = "0U";
    in_stack_ffffffffffffda40 = &local_1b04;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint8_t>(\"0\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
              (local_1ad8,local_1ae8,0x348,1,2,&local_1ae9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),
               (size_t)in_stack_ffffffffffffda68,(const_string *)in_stack_ffffffffffffda60);
    in_stack_ffffffffffffda78 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_57._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_57._M_len = sVar4;
    str_57._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_57._M_str._7_1_ = in_stack_ffffffffffffdabf;
    in_stack_ffffffffffffda77 = LocaleIndependentAtoi<unsigned_char>(str_57);
    local_1b74._vptr_lazy_ostream._0_4_ = 0xff;
    in_stack_ffffffffffffda48 = "255U";
    in_stack_ffffffffffffda40 = &local_1b74;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint8_t>(\"255\")";
    local_1b59 = in_stack_ffffffffffffda77;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
              (local_1b48,local_1b58,0x349,1,2,&local_1b59);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    in_stack_ffffffffffffda76 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffda76);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffda78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffda77,
                        CONCAT16(in_stack_ffffffffffffda76,in_stack_ffffffffffffda70)),line_num,
               (const_string *)in_stack_ffffffffffffda60);
    in_stack_ffffffffffffda60 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffda40,(char (*) [1])in_stack_ffffffffffffda38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffda48,
               (pointer)in_stack_ffffffffffffda40,(unsigned_long)in_stack_ffffffffffffda38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffda5f,
                        CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
               in_stack_ffffffffffffda50);
    str_58._M_str._0_6_ = in_stack_ffffffffffffdab8;
    str_58._M_len = sVar4;
    str_58._M_str._6_1_ = in_stack_ffffffffffffdabe;
    str_58._M_str._7_1_ = in_stack_ffffffffffffdabf;
    in_stack_ffffffffffffda5f = LocaleIndependentAtoi<unsigned_char>(str_58);
    local_1be4._vptr_lazy_ostream._0_4_ = 0xff;
    in_stack_ffffffffffffda48 = "255U";
    in_stack_ffffffffffffda40 = &local_1be4;
    in_stack_ffffffffffffda38 = "LocaleIndependentAtoi<uint8_t>(\"256\")";
    local_1bc9 = in_stack_ffffffffffffda5f;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
              (local_1bb8,local_1bc8,0x34a,1,2,&local_1bc9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffda38);
    in_stack_ffffffffffffda5e = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffda5e);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)in_stack_ffffffffffffda38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LocaleIndependentAtoi)
{
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1234"), 1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("0"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("01234"), 1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1234"), -1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" 1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1 "), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1a"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1.1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1.9"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+01.9"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1"), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" -1"), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1 "), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" -1 "), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" +1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" +1 "), 1);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+-1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-+1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("++1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("--1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(""), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("aap"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("0x1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-32482348723847471234"), -2'147'483'647 - 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("32482348723847471234"), 2'147'483'647);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("-9223372036854775809"), -9'223'372'036'854'775'807LL - 1LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("-9223372036854775808"), -9'223'372'036'854'775'807LL - 1LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("9223372036854775807"), 9'223'372'036'854'775'807);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("9223372036854775808"), 9'223'372'036'854'775'807);

    std::map<std::string, int64_t> atoi64_test_pairs = {
        {"-9223372036854775809", std::numeric_limits<int64_t>::min()},
        {"-9223372036854775808", -9'223'372'036'854'775'807LL - 1LL},
        {"9223372036854775807", 9'223'372'036'854'775'807},
        {"9223372036854775808", std::numeric_limits<int64_t>::max()},
        {"+-", 0},
        {"0x1", 0},
        {"ox1", 0},
        {"", 0},
    };

    for (const auto& pair : atoi64_test_pairs) {
        BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>(pair.first), pair.second);
    }

    // Ensure legacy compatibility with previous versions of Bitcoin Core's atoi64
    for (const auto& pair : atoi64_test_pairs) {
        BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>(pair.first), atoi64_legacy(pair.first));
    }

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("18446744073709551615"), 18'446'744'073'709'551'615ULL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("18446744073709551616"), 18'446'744'073'709'551'615ULL);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-2147483649"), -2'147'483'648LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-2147483648"), -2'147'483'648LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("2147483647"), 2'147'483'647);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("2147483648"), 2'147'483'647);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("4294967295"), 4'294'967'295U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("4294967296"), 4'294'967'295U);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("-32769"), -32'768);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("-32768"), -32'768);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("32767"), 32'767);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("32768"), 32'767);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("65535"), 65'535U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("65536"), 65'535U);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("-129"), -128);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("-128"), -128);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("127"), 127);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("128"), 127);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("255"), 255U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("256"), 255U);
}